

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

bool __thiscall pbrt::Scene::isSingleLevel(Scene *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_> *in_RDI
  ;
  shared_ptr<pbrt::Instance> inst;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
  *__range1;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  __shared_ptr local_38 [8];
  vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
  local_20;
  vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
  *local_18;
  byte local_1;
  
  std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1b6d5b
            );
  bVar1 = std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
          ::empty((vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                   *)in_stack_ffffffffffffffd0);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b6d82);
    local_18 = &peVar2->instances;
    local_20._M_current =
         (shared_ptr<pbrt::Instance> *)
         std::
         vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
         ::begin(in_RDI);
    std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
    ::end(in_RDI);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
                               *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              (__normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
                               *)in_RDI), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
      ::operator*(&local_20);
      std::shared_ptr<pbrt::Instance>::shared_ptr
                ((shared_ptr<pbrt::Instance> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (shared_ptr<pbrt::Instance> *)in_RDI);
      bVar1 = std::__shared_ptr::operator_cast_to_bool(local_38);
      if (bVar1) {
        peVar3 = std::__shared_ptr_access<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b6df2);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar3->object);
        if (!bVar1) goto LAB_001b6e39;
        std::__shared_ptr_access<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1b6e0e);
        std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1b6e1a);
        bVar1 = std::
                vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
                ::empty(in_stack_ffffffffffffffd0);
        if (bVar1) goto LAB_001b6e39;
        local_1 = 0;
        in_stack_ffffffffffffffc4 = 1;
      }
      else {
LAB_001b6e39:
        in_stack_ffffffffffffffc4 = 0;
      }
      std::shared_ptr<pbrt::Instance>::~shared_ptr((shared_ptr<pbrt::Instance> *)0x1b6e4b);
      if (in_stack_ffffffffffffffc4 != 0) goto LAB_001b6e6d;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
      ::operator++(&local_20);
    }
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
LAB_001b6e6d:
  return (bool)(local_1 & 1);
}

Assistant:

bool Scene::isSingleLevel() const
  {
    if (!world->shapes.empty())
      return false;
    for (auto inst : world->instances)
      if (inst && inst->object && !inst->object->instances.empty())
        return false;
    return true;
  }